

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O1

Slot * __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::getSlot
          (Slot *__return_storage_ptr__,TableSlotManager *this,Name func,HeapType type)

{
  _Rb_tree_header *p_Var1;
  Module *pMVar2;
  pointer puVar3;
  char *pcVar4;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> _Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Name func_00;
  Name func_01;
  TableSlotManager *this_00;
  bool bVar8;
  _Base_ptr p_Var9;
  Table *pTVar10;
  Type type_00;
  ElementSegment *pEVar11;
  undefined1 reuse;
  undefined1 auVar12 [8];
  pointer puVar13;
  pointer puVar14;
  long lVar15;
  uint uVar16;
  _Base_ptr p_Var17;
  Name root;
  Name NVar18;
  Name NVar19;
  string_view sVar20;
  Name table;
  Name name;
  Type local_a8;
  TableSlotManager *local_a0;
  HeapType local_98;
  string_view local_90;
  Expression *local_80;
  undefined1 auStack_78 [8];
  Builder builder;
  undefined1 local_50 [8];
  Name func_local;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> local_38;
  
  func_local.super_IString.str._M_len = func.super_IString.str._M_str;
  local_50 = func.super_IString.str._M_len;
  p_Var9 = (this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header;
  p_Var17 = &p_Var1->_M_header;
  local_a0 = this;
  local_98.id = type.id;
  if (p_Var9 != (_Base_ptr)0x0) {
    do {
      bVar8 = IString::operator<((IString *)(p_Var9 + 1),(IString *)local_50);
      if (!bVar8) {
        p_Var17 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[bVar8];
    } while (p_Var9 != (_Base_ptr)0x0);
  }
  p_Var9 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
     (bVar8 = IString::operator<((IString *)local_50,(IString *)(p_Var17 + 1)), p_Var9 = p_Var17,
     bVar8)) {
    p_Var9 = &p_Var1->_M_header;
  }
  this_00 = local_a0;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    *(_Base_ptr *)&__return_storage_ptr__->index = p_Var9[2]._M_left;
    p_Var17 = p_Var9[1]._M_left;
    p_Var6 = p_Var9[1]._M_right;
    p_Var7 = p_Var9[2]._M_parent;
    (__return_storage_ptr__->global).super_IString.str._M_len = *(size_t *)(p_Var9 + 2);
    (__return_storage_ptr__->global).super_IString.str._M_str = (char *)p_Var7;
    (__return_storage_ptr__->tableName).super_IString.str._M_len = (size_t)p_Var17;
    (__return_storage_ptr__->tableName).super_IString.str._M_str = (char *)p_Var6;
    return __return_storage_ptr__;
  }
  if (local_a0->activeSegment != (ElementSegment *)0x0) goto LAB_00ab6545;
  if (local_a0->activeTable == (Table *)0x0) {
    pMVar2 = local_a0->module;
    NVar18 = Name::fromInt(0);
    builder.wasm = (Module *)0x0;
    NVar19.super_IString.str._M_str = (char *)auStack_78;
    NVar19.super_IString.str._M_len = (size_t)NVar18.super_IString.str._M_str;
    auStack_78 = (undefined1  [8])pMVar2;
    NVar19 = Names::getValidName(NVar18.super_IString.str._M_len,NVar19,
                                 (function<bool_(wasm::Name)> *)auStack_78);
    func_local.super_IString.str._M_str = (char *)pMVar2;
    std::
    _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:76:23)>
    ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
    wasm::Type::Type((Type *)auStack_78,(HeapType)0x1,Nullable);
    NVar18.super_IString.str._M_str = NVar19.super_IString.str._M_len;
    NVar18.super_IString.str._M_len = (size_t)&local_38;
    auVar12 = auStack_78;
    Builder::makeTable(NVar18,(Type)NVar19.super_IString.str._M_str,(Address)auStack_78,(Address)0x0
                      );
    reuse = SUB81(auVar12,0);
    pTVar10 = Module::addTable((Module *)func_local.super_IString.str._M_str,
                               (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                               &local_38);
    if ((_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>)
        local_38._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl != (Table *)0x0) {
      operator_delete((void *)local_38._M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,0x50);
    }
    this_00->activeTable = pTVar10;
    auStack_78 = (undefined1  [8])
                 (pTVar10->super_Importable).super_Named.name.super_IString.str._M_len;
    builder.wasm = (Module *)(pTVar10->super_Importable).super_Named.name.super_IString.str._M_str;
    sVar20 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbe8acc),(bool)reuse);
    (this_00->activeBase).tableName.super_IString.str._M_len = (size_t)auStack_78;
    (this_00->activeBase).tableName.super_IString.str._M_str = (char *)builder.wasm;
    (this_00->activeBase).global.super_IString.str = sVar20;
    (this_00->activeBase).index = 0;
  }
  pMVar2 = this_00->module;
  puVar14 = (pMVar2->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pMVar2->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar15 = (long)puVar3 - (long)puVar14 >> 5;
  puVar13 = puVar14;
  if (0 < lVar15) {
    pcVar4 = (this_00->activeTable->super_Importable).super_Named.name.super_IString.str._M_str;
    puVar13 = (pointer)((long)&(puVar14->_M_t).
                               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                       ((long)puVar3 - (long)puVar14 & 0xffffffffffffffe0U));
    lVar15 = lVar15 + 1;
    puVar14 = puVar14 + 2;
    do {
      if (*(char **)((long)&(puVar14[-2]._M_t.
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar4) {
        puVar14 = puVar14 + -2;
        goto LAB_00ab6451;
      }
      if (*(char **)((long)&(puVar14[-1]._M_t.
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar4) {
        puVar14 = puVar14 + -1;
        goto LAB_00ab6451;
      }
      if (*(char **)((long)&((puVar14->_M_t).
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar4) goto LAB_00ab6451;
      if (*(char **)((long)&(puVar14[1]._M_t.
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar4) {
        puVar14 = puVar14 + 1;
        goto LAB_00ab6451;
      }
      lVar15 = lVar15 + -1;
      puVar14 = puVar14 + 4;
    } while (1 < lVar15);
  }
  lVar15 = (long)puVar3 - (long)puVar13 >> 3;
  if (lVar15 == 1) {
LAB_00ab6429:
    puVar14 = puVar13;
    if (*(char **)((long)&((puVar13->_M_t).
                           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table + 8) !=
        (this_00->activeTable->super_Importable).super_Named.name.super_IString.str._M_str) {
      puVar14 = puVar3;
    }
  }
  else if (lVar15 == 2) {
LAB_00ab6414:
    puVar14 = puVar13;
    if (*(char **)((long)&((puVar13->_M_t).
                           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table + 8) !=
        (this_00->activeTable->super_Importable).super_Named.name.super_IString.str._M_str) {
      puVar13 = puVar13 + 1;
      goto LAB_00ab6429;
    }
  }
  else {
    puVar14 = puVar3;
    if ((lVar15 == 3) &&
       (puVar14 = puVar13,
       *(char **)((long)&((puVar13->_M_t).
                          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->table
                 + 8) !=
       (this_00->activeTable->super_Importable).super_Named.name.super_IString.str._M_str)) {
      puVar13 = puVar13 + 1;
      goto LAB_00ab6414;
    }
  }
LAB_00ab6451:
  if (puVar14 != puVar3) {
    __assert_fail("std::all_of(module.elementSegments.begin(), module.elementSegments.end(), [&](std::unique_ptr<ElementSegment>& segment) { return segment->table != activeTable->name; })"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-splitting.cpp"
                  ,0xe7,
                  "TableSlotManager::Slot wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::getSlot(Name, HeapType)"
                 );
  }
  NVar19 = Name::fromInt(0);
  builder.wasm = (Module *)0x0;
  root.super_IString.str._M_str = (char *)auStack_78;
  root.super_IString.str._M_len = (size_t)NVar19.super_IString.str._M_str;
  auStack_78 = (undefined1  [8])pMVar2;
  local_90 = (string_view)
             Names::getValidName(NVar19.super_IString.str._M_len,root,
                                 (function<bool_(wasm::Name)> *)auStack_78);
  func_local.super_IString.str._M_str = (char *)pMVar2;
  std::
  _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:84:11)>
  ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
  pcVar4 = (char *)(this_00->activeTable->super_Importable).super_Named.name.super_IString.str.
                   _M_len;
  local_80 = (Expression *)
             (this_00->activeTable->super_Importable).super_Named.name.super_IString.str._M_str;
  auStack_78 = (undefined1  [8])this_00->module;
  type_00.id = (uintptr_t)Builder::makeConst<int>((Builder *)auStack_78,0);
  wasm::Type::Type(&local_a8,(HeapType)0x1,Nullable);
  table.super_IString.str._M_str = pcVar4;
  table.super_IString.str._M_len = (size_t)local_90._M_str;
  name.super_IString.str._M_str = (char *)local_90._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeElementSegment(name,table,local_80,type_00);
  pEVar11 = Module::addElementSegment
                      ((Module *)func_local.super_IString.str._M_str,
                       (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                        *)&local_38);
  if (local_38._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>)0x0) {
    std::default_delete<wasm::ElementSegment>::operator()
              ((default_delete<wasm::ElementSegment> *)&local_38,
               (ElementSegment *)
               local_38._M_t.
               super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
  }
  this_00->activeSegment = pEVar11;
LAB_00ab6545:
  pcVar4 = (this_00->activeBase).tableName.super_IString.str._M_str;
  (__return_storage_ptr__->tableName).super_IString.str._M_len =
       (this_00->activeBase).tableName.super_IString.str._M_len;
  (__return_storage_ptr__->tableName).super_IString.str._M_str = pcVar4;
  pcVar4 = (this_00->activeBase).global.super_IString.str._M_str;
  (__return_storage_ptr__->global).super_IString.str._M_len =
       (this_00->activeBase).global.super_IString.str._M_len;
  (__return_storage_ptr__->global).super_IString.str._M_str = pcVar4;
  pEVar11 = this_00->activeSegment;
  uVar16 = (int)((ulong)((long)(pEVar11->data).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pEVar11->data).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) +
           (this_00->activeBase).index;
  __return_storage_ptr__->index = uVar16;
  auStack_78 = (undefined1  [8])this_00->module;
  func_00.super_IString.str._M_str = (char *)func_local.super_IString.str._M_len;
  func_00.super_IString.str._M_len = (size_t)local_50;
  local_38._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
       Builder::makeRefFunc((Builder *)auStack_78,func_00,local_98);
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pEVar11->data,
             (Expression **)&local_38);
  func_01.super_IString.str._M_str = (char *)func_local.super_IString.str._M_len;
  func_01.super_IString.str._M_len = (size_t)local_50;
  addSlot(this_00,func_01,*__return_storage_ptr__);
  pTVar10 = this_00->activeTable;
  if ((pTVar10->initial).addr <= (ulong)uVar16) {
    (pTVar10->initial).addr = (ulong)(uVar16 + 1);
    _Var5._M_head_impl =
         (this_00->module->dylinkSection)._M_t.
         super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
         super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
         super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    if (_Var5._M_head_impl != (DylinkSection *)0x0) {
      (_Var5._M_head_impl)->tableSize = uVar16 + 1;
    }
  }
  if ((pTVar10->max).addr <= (ulong)uVar16) {
    (pTVar10->max).addr = (ulong)(uVar16 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TableSlotManager::Slot TableSlotManager::getSlot(Name func, HeapType type) {
  auto slotIt = funcIndices.find(func);
  if (slotIt != funcIndices.end()) {
    return slotIt->second;
  }

  // If there are no segments yet, allocate one.
  if (activeSegment == nullptr) {
    if (activeTable == nullptr) {
      activeTable = makeTable();
      activeBase = {activeTable->name, "", 0};
    }

    // None of the existing segments should refer to the active table
    assert(std::all_of(module.elementSegments.begin(),
                       module.elementSegments.end(),
                       [&](std::unique_ptr<ElementSegment>& segment) {
                         return segment->table != activeTable->name;
                       }));

    activeSegment = makeElementSegment();
  }

  Slot newSlot = {activeBase.tableName,
                  activeBase.global,
                  activeBase.index + Index(activeSegment->data.size())};

  Builder builder(module);
  activeSegment->data.push_back(builder.makeRefFunc(func, type));

  addSlot(func, newSlot);
  if (activeTable->initial <= newSlot.index) {
    activeTable->initial = newSlot.index + 1;
    // TODO: handle the active table not being the dylink table (#3823)
    if (module.dylinkSection) {
      module.dylinkSection->tableSize = activeTable->initial;
    }
  }
  if (activeTable->max <= newSlot.index) {
    activeTable->max = newSlot.index + 1;
  }
  return newSlot;
}